

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::copyFrom(UnicodeSet *this,UnicodeSet *o,UBool asThawed)

{
  int iVar1;
  BMPSet *this_00;
  UnicodeSetStringSpan *this_01;
  UChar32 *__src;
  UVector *other;
  UErrorCode ec;
  UErrorCode local_64;
  UnicodeString local_60;
  
  if (this == o) {
    return this;
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) {
    return this;
  }
  if ((o->fFlags & 1) == 0) {
    local_64 = U_ZERO_ERROR;
    ensureCapacity(this,o->len,&local_64);
    if (U_ZERO_ERROR < local_64) {
      return this;
    }
    iVar1 = o->len;
    this->len = iVar1;
    __src = o->list;
    memcpy(this->list,__src,(long)iVar1 << 2);
    this_00 = (BMPSet *)0x0;
    if ((asThawed == '\0') && (o->bmpSet != (BMPSet *)0x0)) {
      this_00 = (BMPSet *)UMemory::operator_new((UMemory *)0x368,(size_t)__src);
      if (this_00 == (BMPSet *)0x0) {
        this->bmpSet = (BMPSet *)0x0;
        goto LAB_002eb67c;
      }
      BMPSet::BMPSet(this_00,o->bmpSet,this->list,this->len);
    }
    this->bmpSet = this_00;
    if ((this->strings != (UVector *)0x0) && (other = o->strings, other != (UVector *)0x0)) {
      UVector::assign(this->strings,other,cloneUnicodeString,&local_64);
      this_01 = (UnicodeSetStringSpan *)0x0;
      if ((asThawed == '\0') && (o->stringSpan != (UnicodeSetStringSpan *)0x0)) {
        this_01 = (UnicodeSetStringSpan *)UMemory::operator_new((UMemory *)0x118,(size_t)other);
        if (this_01 == (UnicodeSetStringSpan *)0x0) {
          this->stringSpan = (UnicodeSetStringSpan *)0x0;
          goto LAB_002eb67c;
        }
        UnicodeSetStringSpan::UnicodeSetStringSpan(this_01,o->stringSpan,this->strings);
      }
      this->stringSpan = this_01;
      if (this->pat != (char16_t *)0x0) {
        uprv_free_63(this->pat);
        this->pat = (char16_t *)0x0;
        this->patLen = 0;
      }
      if (o->pat == (UChar *)0x0) {
        return this;
      }
      UnicodeString::UnicodeString(&local_60,o->pat,o->patLen);
      setPattern(this,&local_60);
      UnicodeString::~UnicodeString(&local_60);
      return this;
    }
  }
LAB_002eb67c:
  clear(this);
  this->fFlags = '\x01';
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::copyFrom(const UnicodeSet& o, UBool asThawed) {
    if (this == &o) {
        return *this;
    }
    if (isFrozen()) {
        return *this;
    }
    if (o.isBogus()) {
        setToBogus();
        return *this;
    }
    UErrorCode ec = U_ZERO_ERROR;
    ensureCapacity(o.len, ec);
    if (U_FAILURE(ec)) {
        // ensureCapacity will mark the UnicodeSet as Bogus if OOM failure happens.
        return *this;
    }
    len = o.len;
    uprv_memcpy(list, o.list, (size_t)len*sizeof(UChar32));
    if (o.bmpSet == NULL || asThawed) {
        bmpSet = NULL;
    } else {
        bmpSet = new BMPSet(*o.bmpSet, list, len);
        if (bmpSet == NULL) { // Check for memory allocation error.
            setToBogus();
            return *this;
        }
    }
    if (strings != NULL && o.strings != NULL) {
        strings->assign(*o.strings, cloneUnicodeString, ec);
    } else { // Invalid strings.
        setToBogus();
        return *this;
    }
    if (o.stringSpan == NULL || asThawed) {
        stringSpan = NULL;
    } else {
        stringSpan = new UnicodeSetStringSpan(*o.stringSpan, *strings);
        if (stringSpan == NULL) { // Check for memory allocation error.
            setToBogus();
            return *this;
        }
    }
    releasePattern();
    if (o.pat) {
        setPattern(UnicodeString(o.pat, o.patLen));
    }
    return *this;
}